

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O0

void __thiscall DIS::AggregateStatePdu::unmarshal(AggregateStatePdu *this,DataStream *dataStream)

{
  undefined1 local_c0 [8];
  VariableDatum x_4;
  size_t idx_4;
  EntityType x_3;
  size_t idx_3;
  EntityType x_2;
  size_t idx_2;
  EntityID x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  AggregateID x;
  size_t idx;
  DataStream *dataStream_local;
  AggregateStatePdu *this_local;
  
  EntityManagementFamilyPdu::unmarshal(&this->super_EntityManagementFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_aggregateID,dataStream);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_aggregateState);
  EntityType::unmarshal(&this->_aggregateType,dataStream);
  DataStream::operator>>(dataStream,&this->_formation);
  AggregateMarking::unmarshal(&this->_aggregateMarking,dataStream);
  Vector3Float::unmarshal(&this->_dimensions,dataStream);
  Orientation::unmarshal(&this->_orientation,dataStream);
  Vector3Double::unmarshal(&this->_centerOfMass,dataStream);
  Vector3Float::unmarshal(&this->_velocity,dataStream);
  DataStream::operator>>(dataStream,&this->_numberOfDisAggregates);
  DataStream::operator>>(dataStream,&this->_numberOfDisEntities);
  DataStream::operator>>(dataStream,&this->_numberOfSilentAggregateTypes);
  DataStream::operator>>(dataStream,&this->_numberOfSilentEntityTypes);
  std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::clear(&this->_aggregateIDList);
  x._site = 0;
  x._application = 0;
  x._aggregateID = 0;
  x._14_2_ = 0;
  for (; (ulong)x._8_8_ < (ulong)this->_numberOfDisAggregates; x._8_8_ = x._8_8_ + 1) {
    AggregateID::AggregateID((AggregateID *)local_30);
    AggregateID::unmarshal((AggregateID *)local_30,dataStream);
    std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::push_back
              (&this->_aggregateIDList,(value_type *)local_30);
    AggregateID::~AggregateID((AggregateID *)local_30);
  }
  std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::clear(&this->_entityIDList);
  x_1._site = 0;
  x_1._application = 0;
  x_1._entity = 0;
  x_1._14_2_ = 0;
  for (; (ulong)x_1._8_8_ < (ulong)this->_numberOfDisEntities; x_1._8_8_ = x_1._8_8_ + 1) {
    EntityID::EntityID((EntityID *)&idx_2);
    EntityID::unmarshal((EntityID *)&idx_2,dataStream);
    std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::push_back
              (&this->_entityIDList,(value_type *)&idx_2);
    EntityID::~EntityID((EntityID *)&idx_2);
  }
  DataStream::operator>>(dataStream,&this->_pad2);
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::clear
            (&this->_silentAggregateSystemList);
  x_2._entityKind = '\0';
  x_2._domain = '\0';
  x_2._country = 0;
  x_2._category = '\0';
  x_2._subcategory = '\0';
  x_2._specific = '\0';
  x_2._extra = '\0';
  for (; (ulong)x_2._8_8_ < (ulong)this->_numberOfSilentAggregateTypes; x_2._8_8_ = x_2._8_8_ + 1) {
    EntityType::EntityType((EntityType *)&idx_3);
    EntityType::unmarshal((EntityType *)&idx_3,dataStream);
    std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::push_back
              (&this->_silentAggregateSystemList,(value_type *)&idx_3);
    EntityType::~EntityType((EntityType *)&idx_3);
  }
  std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::clear
            (&this->_silentEntitySystemList);
  x_3._entityKind = '\0';
  x_3._domain = '\0';
  x_3._country = 0;
  x_3._category = '\0';
  x_3._subcategory = '\0';
  x_3._specific = '\0';
  x_3._extra = '\0';
  for (; (ulong)x_3._8_8_ < (ulong)this->_numberOfSilentEntityTypes; x_3._8_8_ = x_3._8_8_ + 1) {
    EntityType::EntityType((EntityType *)&idx_4);
    EntityType::unmarshal((EntityType *)&idx_4,dataStream);
    std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::push_back
              (&this->_silentEntitySystemList,(value_type *)&idx_4);
    EntityType::~EntityType((EntityType *)&idx_4);
  }
  DataStream::operator>>(dataStream,&this->_numberOfVariableDatumRecords);
  std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::clear
            (&this->_variableDatumList);
  x_4._arrayLength = 0;
  x_4._44_4_ = 0;
  for (; (ulong)x_4._40_8_ < (ulong)this->_numberOfVariableDatumRecords; x_4._40_8_ = x_4._40_8_ + 1
      ) {
    VariableDatum::VariableDatum((VariableDatum *)local_c0);
    VariableDatum::unmarshal((VariableDatum *)local_c0,dataStream);
    std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::push_back
              (&this->_variableDatumList,(value_type *)local_c0);
    VariableDatum::~VariableDatum((VariableDatum *)local_c0);
  }
  return;
}

Assistant:

void AggregateStatePdu::unmarshal(DataStream& dataStream)
{
    EntityManagementFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _aggregateID.unmarshal(dataStream);
    dataStream >> _forceID;
    dataStream >> _aggregateState;
    _aggregateType.unmarshal(dataStream);
    dataStream >> _formation;
    _aggregateMarking.unmarshal(dataStream);
    _dimensions.unmarshal(dataStream);
    _orientation.unmarshal(dataStream);
    _centerOfMass.unmarshal(dataStream);
    _velocity.unmarshal(dataStream);
    dataStream >> _numberOfDisAggregates;
    dataStream >> _numberOfDisEntities;
    dataStream >> _numberOfSilentAggregateTypes;
    dataStream >> _numberOfSilentEntityTypes;

     _aggregateIDList.clear();
     for(size_t idx = 0; idx < _numberOfDisAggregates; idx++)
     {
        AggregateID x;
        x.unmarshal(dataStream);
        _aggregateIDList.push_back(x);
     }

     _entityIDList.clear();
     for(size_t idx = 0; idx < _numberOfDisEntities; idx++)
     {
        EntityID x;
        x.unmarshal(dataStream);
        _entityIDList.push_back(x);
     }
    dataStream >> _pad2;

     _silentAggregateSystemList.clear();
     for(size_t idx = 0; idx < _numberOfSilentAggregateTypes; idx++)
     {
        EntityType x;
        x.unmarshal(dataStream);
        _silentAggregateSystemList.push_back(x);
     }

     _silentEntitySystemList.clear();
     for(size_t idx = 0; idx < _numberOfSilentEntityTypes; idx++)
     {
        EntityType x;
        x.unmarshal(dataStream);
        _silentEntitySystemList.push_back(x);
     }
    dataStream >> _numberOfVariableDatumRecords;

     _variableDatumList.clear();
     for(size_t idx = 0; idx < _numberOfVariableDatumRecords; idx++)
     {
        VariableDatum x;
        x.unmarshal(dataStream);
        _variableDatumList.push_back(x);
     }
}